

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O3

MaybeResult<wasm::Ok> *
wasm::WATParser::block<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  Lexer *this;
  undefined1 *puVar1;
  undefined8 *puVar2;
  _Uninitialized<wasm::HeapType,_true> _Var3;
  size_t sVar4;
  optional<wasm::Name> label_00;
  bool bVar5;
  undefined7 in_register_00000009;
  __index_type _Var6;
  _Alloc_hider _Var7;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  undefined1 local_130 [8];
  Result<wasm::HeapType> type;
  optional<wasm::Name> label;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_d0;
  string local_b0;
  vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> *local_90;
  undefined1 local_88 [8];
  optional<wasm::Name> id;
  undefined1 local_58 [8];
  Result<wasm::HeapType> _val;
  
  this = &ctx->in;
  sVar4 = (ctx->in).pos;
  local_90 = annotations;
  if ((int)CONCAT71(in_register_00000009,folded) == 0) {
    expected_00._M_str = "block";
    expected_00._M_len = 5;
    bVar5 = Lexer::takeKeyword(this,expected_00);
  }
  else {
    expected._M_str = "block";
    expected._M_len = 5;
    bVar5 = Lexer::takeSExprStart(this,expected);
  }
  if (bVar5 == false) {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x01';
    return __return_storage_ptr__;
  }
  Lexer::takeID((optional<wasm::Name> *)
                ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),this);
  blocktype<wasm::WATParser::ParseDefsCtx>((Result<wasm::HeapType> *)local_130,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)local_58,
             (_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)local_130);
  if (_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x01') {
    puVar1 = (undefined1 *)
             ((long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                     super__Optional_payload_base<wasm::Name>._M_payload + 8);
    local_88 = (undefined1  [8])puVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_58,
               (undefined1 *)
               ((long)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first.
                      _M_storage.id + (long)local_58));
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
    if (local_88 == (undefined1  [8])puVar1) {
      *puVar2 = CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                         id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_88;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                    id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_58);
    goto LAB_00c03c7a;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_58);
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._17_7_ =
       label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._9_7_;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_engaged =
       (bool)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._8_1_;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
       (char *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
  ;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
       type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
       super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
       super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
       super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
       super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
       super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._32_8_;
  ParseDefsCtx::makeBlock
            ((Result<wasm::Ok> *)local_58,ctx,(Index)sVar4,local_90,label_00,(HeapType)local_130);
  if (_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x01') {
    local_88 = (undefined1  [8])
               ((long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_payload + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_88,local_58,
               (undefined1 *)
               ((long)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first.
                      _M_storage.id + (long)local_58));
LAB_00c03c23:
    puVar2 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
    if (local_88 ==
        (undefined1  [8])
        ((long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload + 8)) {
      *puVar2 = CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                         id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
           id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._16_8_;
    }
    else {
      *(undefined1 (*) [8])
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_88;
      *(ulong *)((long)&(__return_storage_ptr__->val).
                        super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
           CONCAT71(id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_payload._9_7_,
                    id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_payload._8_1_);
    }
    *(size_t *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8) =
         id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
         super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
    instrs<wasm::WATParser::ParseDefsCtx>((Result<wasm::Ok> *)local_58,ctx);
    if (_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x01') {
      local_88 = (undefined1  [8])
                 ((long)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::Name>._M_payload + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_88,local_58,
                 (undefined1 *)
                 ((long)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first.
                        _M_storage.id + (long)local_58));
      goto LAB_00c03c23;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
    if (!folded) {
      expected_01._M_str = "end";
      expected_01._M_len = 3;
      bVar5 = Lexer::takeKeyword(this,expected_01);
      if (bVar5) {
        Lexer::takeID((optional<wasm::Name> *)local_88,this);
        if ((id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._8_1_ != '\x01') ||
           ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
            (id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
             == label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str.
                _M_len)))) goto LAB_00c03dca;
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"end label does not match block label","");
        Lexer::err((Err *)local_58,this,&local_b0);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
        _Var3._M_storage.id =
             (HeapType)
             ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
        if ((HeapType)local_58 == _Var3._M_storage.id) {
          *puVar2 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                             super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                             _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                             super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                        _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
        }
        ((_Uninitialized<wasm::HeapType,_true> *)
        ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
             (HeapType)
             _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id;
        _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
             (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
        _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        local_d0.field_2._M_allocated_capacity = local_b0.field_2._M_allocated_capacity;
        _Var7._M_p = local_b0._M_dataplus._M_p;
        local_58 = (undefined1  [8])_Var3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p == &local_b0.field_2) goto LAB_00c03c7a;
      }
      else {
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"expected \'end\' at end of block","");
        Lexer::err((Err *)local_58,this,&local_d0);
        puVar2 = (undefined8 *)
                 ((long)&(__return_storage_ptr__->val).
                         super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                         super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
        *(undefined8 **)
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
        _Var3._M_storage.id =
             (HeapType)
             ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                     super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                     super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
        if ((HeapType)local_58 == _Var3._M_storage.id) {
          *puVar2 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                             super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                             _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                             super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
               _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
               super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
               super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
               super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._16_8_;
        }
        else {
          *(undefined1 (*) [8])
           &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
          *(ulong *)((long)&(__return_storage_ptr__->val).
                            super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                            super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
               CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                        _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
        }
        ((_Uninitialized<wasm::HeapType,_true> *)
        ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
             (HeapType)
             _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id;
        _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
             (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
        _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
        *(__index_type *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
        _Var7._M_p = local_d0._M_dataplus._M_p;
        local_58 = (undefined1  [8])_Var3;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p == &local_d0.field_2) goto LAB_00c03c7a;
      }
LAB_00c03f06:
      local_58 = (undefined1  [8])
                 ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                         super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                         super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
           (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
      operator_delete(_Var7._M_p,local_d0.field_2._M_allocated_capacity + 1);
      goto LAB_00c03c7a;
    }
    bVar5 = Lexer::takeRParen(this);
    if (!bVar5) {
      label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::Name>._16_8_ = &local_e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)
                 &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged,
                 "expected \')\' at end of block","");
      Lexer::err((Err *)local_58,this,
                 (string *)
                 &label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::Name>._M_engaged);
      puVar2 = (undefined8 *)
               ((long)&(__return_storage_ptr__->val).
                       super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                       super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      *(undefined8 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = puVar2;
      _Var3._M_storage.id =
           (HeapType)
           ((long)&_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                   super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                   super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                   super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 8);
      if ((HeapType)local_58 == _Var3._M_storage.id) {
        *puVar2 = CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                           _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                 super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x18) =
             _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
             super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
             super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
             super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._16_8_;
      }
      else {
        *(undefined1 (*) [8])
         &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> = local_58;
        *(ulong *)((long)&(__return_storage_ptr__->val).
                          super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                          super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10) =
             CONCAT71(_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._9_7_,
                      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_);
      }
      ((_Uninitialized<wasm::HeapType,_true> *)
      ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 8))->_M_storage =
           (HeapType)
           _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
           super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first._M_storage.id =
           (_Uninitialized<wasm::HeapType,_true>)(HeapType)0x0;
      _val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
      super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
      super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
      super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._8_1_ = 0;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = '\x02';
      local_d0.field_2._M_allocated_capacity = local_e0._M_allocated_capacity;
      _Var7._M_p = (pointer)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::Name>._16_8_;
      local_58 = (undefined1  [8])_Var3;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._16_8_ == &local_e0) goto LAB_00c03c7a;
      goto LAB_00c03f06;
    }
LAB_00c03dca:
    ParseDefsCtx::visitEnd((Result<wasm::Ok> *)local_58,ctx);
    if (_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._24_1_ == '\x01') {
      *(undefined1 **)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> =
           (undefined1 *)
           ((long)&(__return_storage_ptr__->val).
                   super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
                   super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x10);
      _Var6 = '\x02';
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,local_58,
                 (undefined1 *)
                 ((long)_val.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                        super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                        super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::HeapType,_wasm::Err>.
                        super__Variant_storage_alias<wasm::HeapType,_wasm::Err>._M_u._M_first.
                        _M_storage.id + (long)local_58));
    }
    else {
      _Var6 = '\0';
    }
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Copy_ctor_alias<wasm::Ok,_wasm::None,_wasm::Err>.
             super__Variant_storage_alias<wasm::Ok,_wasm::None,_wasm::Err> + 0x20) = _Var6;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)local_58);
LAB_00c03c7a:
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_130);
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<>
block(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("block"sv)) ||
      (!folded && !ctx.in.takeKeyword("block"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  CHECK_ERR(ctx.makeBlock(pos, annotations, label, *type));

  CHECK_ERR(instrs(ctx));

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of block");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of block");
    }
    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match block label");
    }
  }

  return ctx.visitEnd();
}